

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int codeAllEqualityTerms(Parse *pParse,WhereLevel *pLevel,int bRev,int nExtraReg,char **pzAff)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  sqlite3 *db;
  Vdbe *p;
  WhereLoop *pWVar4;
  Index *pIdx;
  WhereTerm *pTerm;
  Expr *p_00;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  Op *pOVar10;
  int p2;
  int iTarget;
  uint p4;
  ulong uVar11;
  uint p2_00;
  
  db = pParse->db;
  p = pParse->pVdbe;
  pWVar4 = pLevel->pWLoop;
  uVar2 = (pWVar4->u).btree.nEq;
  uVar3 = pWVar4->nSkip;
  pIdx = (pWVar4->u).btree.pIndex;
  iVar6 = pParse->nMem;
  pParse->nMem = nExtraReg + (uint)uVar2 + iVar6;
  pcVar9 = pIdx->zColAff;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = computeIndexAffStr(db,pIdx);
  }
  p2 = iVar6 + 1;
  pcVar9 = sqlite3DbStrDup(db,pcVar9);
  p4 = (uint)uVar3;
  if (uVar3 != 0) {
    iVar8 = pLevel->iIdxCur;
    p2_00 = 0;
    sqlite3VdbeAddOp3(p,0x4b,0,p2,iVar6 + p4);
    sqlite3VdbeAddOp3(p,(uint)(bRev == 0) * 4 + 0x20,iVar8,0,0);
    iVar6 = sqlite3VdbeAddOp3(p,9,0,0,0);
    iVar7 = sqlite3VdbeAddOp4Int(p,(uint)(bRev == 0) * 3 + 0x15,iVar8,0,p2,p4);
    pLevel->addrSkip = iVar7;
    if (p->db->mallocFailed == '\0') {
      pOVar10 = p->aOp + iVar6;
    }
    else {
      pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar10->p2 = p->nOp;
    do {
      sqlite3VdbeAddOp3(p,0x5e,iVar8,p2_00,p2 + p2_00);
      p2_00 = p2_00 + 1;
    } while (p4 != p2_00);
  }
  if (uVar3 < uVar2) {
    uVar11 = (ulong)p4;
    do {
      pTerm = pWVar4->aLTerm[uVar11];
      iVar6 = (int)uVar11;
      iTarget = p2 + iVar6;
      iVar7 = codeEqualityTerm(pParse,pTerm,pLevel,iVar6,bRev,iTarget);
      iVar8 = p2;
      if (iTarget != iVar7) {
        if (nExtraReg + (uint)uVar2 == 1) {
          iVar8 = iVar7;
          if (p2 != 0) {
            bVar1 = pParse->nTempReg;
            if ((ulong)bVar1 < 8) {
              pParse->nTempReg = bVar1 + 1;
              pParse->aTempReg[bVar1] = p2;
            }
          }
        }
        else {
          sqlite3VdbeAddOp3(p,0x50,iVar7,iTarget,0);
        }
      }
      p2 = iVar8;
      if ((pTerm->eOperator & 1) == 0) {
        if ((pTerm->eOperator >> 8 & 1) == 0) {
          p_00 = pTerm->pExpr->pRight;
          if (((pTerm->wtFlags & 0x800) == 0) && (iVar8 = sqlite3ExprCanBeNull(p_00), iVar8 != 0)) {
            sqlite3VdbeAddOp3(p,0x33,iVar6 + p2,pLevel->addrBrk,0);
          }
          if (pParse->nErr == 0) {
            cVar5 = sqlite3CompareAffinity(p_00,pcVar9[uVar11]);
            if (cVar5 == 'A') {
              pcVar9[uVar11] = 'A';
              cVar5 = 'A';
            }
            else {
              cVar5 = pcVar9[uVar11];
            }
            iVar6 = sqlite3ExprNeedsNoAffinityChange(p_00,cVar5);
            if (iVar6 != 0) goto LAB_0019f781;
          }
        }
      }
      else if (((pTerm->pExpr->flags & 0x1000) != 0) && (pcVar9 != (char *)0x0)) {
LAB_0019f781:
        pcVar9[uVar11] = 'A';
      }
      uVar11 = uVar11 + 1;
    } while (uVar2 != uVar11);
  }
  *pzAff = pcVar9;
  return p2;
}

Assistant:

static int codeAllEqualityTerms(
  Parse *pParse,        /* Parsing context */
  WhereLevel *pLevel,   /* Which nested loop of the FROM we are coding */
  int bRev,             /* Reverse the order of IN operators */
  int nExtraReg,        /* Number of extra registers to allocate */
  char **pzAff          /* OUT: Set to point to affinity string */
){
  u16 nEq;                      /* The number of == or IN constraints to code */
  u16 nSkip;                    /* Number of left-most columns to skip */
  Vdbe *v = pParse->pVdbe;      /* The vm under construction */
  Index *pIdx;                  /* The index being used for this loop */
  WhereTerm *pTerm;             /* A single constraint term */
  WhereLoop *pLoop;             /* The WhereLoop object */
  int j;                        /* Loop counter */
  int regBase;                  /* Base register */
  int nReg;                     /* Number of registers to allocate */
  char *zAff;                   /* Affinity string to return */

  /* This module is only called on query plans that use an index. */
  pLoop = pLevel->pWLoop;
  assert( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 );
  nEq = pLoop->u.btree.nEq;
  nSkip = pLoop->nSkip;
  pIdx = pLoop->u.btree.pIndex;
  assert( pIdx!=0 );

  /* Figure out how many memory cells we will need then allocate them.
  */
  regBase = pParse->nMem + 1;
  nReg = nEq + nExtraReg;
  pParse->nMem += nReg;

  zAff = sqlite3DbStrDup(pParse->db,sqlite3IndexAffinityStr(pParse->db,pIdx));
  assert( zAff!=0 || pParse->db->mallocFailed );

  if( nSkip ){
    int iIdxCur = pLevel->iIdxCur;
    sqlite3VdbeAddOp3(v, OP_Null, 0, regBase, regBase+nSkip-1);
    sqlite3VdbeAddOp1(v, (bRev?OP_Last:OP_Rewind), iIdxCur);
    VdbeCoverageIf(v, bRev==0);
    VdbeCoverageIf(v, bRev!=0);
    VdbeComment((v, "begin skip-scan on %s", pIdx->zName));
    j = sqlite3VdbeAddOp0(v, OP_Goto);
    assert( pLevel->addrSkip==0 );
    pLevel->addrSkip = sqlite3VdbeAddOp4Int(v, (bRev?OP_SeekLT:OP_SeekGT),
                            iIdxCur, 0, regBase, nSkip);
    VdbeCoverageIf(v, bRev==0);
    VdbeCoverageIf(v, bRev!=0);
    sqlite3VdbeJumpHere(v, j);
    for(j=0; j<nSkip; j++){
      sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, j, regBase+j);
      testcase( pIdx->aiColumn[j]==XN_EXPR );
      VdbeComment((v, "%s", explainIndexColumnName(pIdx, j)));
    }
  }

  /* Evaluate the equality constraints
  */
  assert( zAff==0 || (int)strlen(zAff)>=nEq );
  for(j=nSkip; j<nEq; j++){
    int r1;
    pTerm = pLoop->aLTerm[j];
    assert( pTerm!=0 );
    /* The following testcase is true for indices with redundant columns.
    ** Ex: CREATE INDEX i1 ON t1(a,b,a); SELECT * FROM t1 WHERE a=0 AND b=0; */
    testcase( (pTerm->wtFlags & TERM_CODED)!=0 );
    testcase( pTerm->wtFlags & TERM_VIRTUAL );
    r1 = codeEqualityTerm(pParse, pTerm, pLevel, j, bRev, regBase+j);
    if( r1!=regBase+j ){
      if( nReg==1 ){
        sqlite3ReleaseTempReg(pParse, regBase);
        regBase = r1;
      }else{
        sqlite3VdbeAddOp2(v, OP_Copy, r1, regBase+j);
      }
    }
    if( pTerm->eOperator & WO_IN ){
      if( pTerm->pExpr->flags & EP_xIsSelect ){
        /* No affinity ever needs to be (or should be) applied to a value
        ** from the RHS of an "? IN (SELECT ...)" expression. The
        ** sqlite3FindInIndex() routine has already ensured that the
        ** affinity of the comparison has been applied to the value.  */
        if( zAff ) zAff[j] = SQLITE_AFF_BLOB;
      }
    }else if( (pTerm->eOperator & WO_ISNULL)==0 ){
      Expr *pRight = pTerm->pExpr->pRight;
      if( (pTerm->wtFlags & TERM_IS)==0 && sqlite3ExprCanBeNull(pRight) ){
        sqlite3VdbeAddOp2(v, OP_IsNull, regBase+j, pLevel->addrBrk);
        VdbeCoverage(v);
      }
      if( pParse->nErr==0 ){
        assert( pParse->db->mallocFailed==0 );
        if( sqlite3CompareAffinity(pRight, zAff[j])==SQLITE_AFF_BLOB ){
          zAff[j] = SQLITE_AFF_BLOB;
        }
        if( sqlite3ExprNeedsNoAffinityChange(pRight, zAff[j]) ){
          zAff[j] = SQLITE_AFF_BLOB;
        }
      }
    }
  }
  *pzAff = zAff;
  return regBase;
}